

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void print_number_of_quasiparticles(void)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ostream *poVar4;
  int j;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int i;
  int iVar9;
  int *piVar10;
  undefined8 auStack_60 [3];
  undefined8 local_48;
  int aiStack_40 [4];
  
  local_48 = (ulong)(n_ion_populations + 3);
  uVar6 = (ulong)(n_ion_populations + 3) * 4 + 0xf & 0xfffffffffffffff0;
  lVar2 = -uVar6;
  piVar10 = (int *)((long)aiStack_40 + lVar2 + -8);
  *(undefined8 *)piVar10 =
       *(undefined8 *)
        ((long)psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
               _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
               super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 200);
  uVar3 = local_48;
  *(undefined4 *)((long)aiStack_40 - uVar6) =
       *(undefined4 *)
        ((long)psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
               _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
               super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0xd0);
  for (uVar6 = 0; (uint)(~(n_ion_populations >> 0x1f) & n_ion_populations) != uVar6;
      uVar6 = uVar6 + 1) {
    *(undefined4 *)((long)aiStack_40 + uVar6 * 4 + lVar2 + 4) =
         *(undefined4 *)
          (*(long *)((long)psr._M_t.
                           super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                           .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0xd8) +
          uVar6 * 4);
  }
  if (mpi_rank == 0) {
    aiStack_40[2] = 0;
    iVar7 = 0;
    iVar8 = 0;
    aiStack_40[3] = 0;
    for (iVar9 = 0; uVar3 = local_48, iVar9 < n_sr; iVar9 = iVar9 + 1) {
      if (iVar9 != 0) {
        *(undefined8 *)((long)auStack_60 + lVar2 + 8) = 0;
        *(undefined8 *)((long)auStack_60 + lVar2) = 0x11bd10;
        MPI_Recv(piVar10,uVar3,&ompi_mpi_int,iVar9,0,&ompi_mpi_comm_world);
      }
      iVar8 = iVar8 + *(int *)((long)aiStack_40 + lVar2 + -4);
      iVar7 = iVar7 + *(int *)((long)aiStack_40 + lVar2);
      aiStack_40[3] = aiStack_40[3] + *piVar10;
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11bd32;
      poVar4 = std::operator<<((ostream *)&std::cout," Thread #");
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11bd3d;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar9);
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11bd4c;
      poVar4 = std::operator<<(poVar4,":\t");
      iVar1 = *piVar10;
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11bd57;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11bd66;
      poVar4 = std::operator<<(poVar4," e, ");
      iVar1 = *(int *)((long)aiStack_40 + lVar2 + -4);
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11bd72;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11bd81;
      poVar4 = std::operator<<(poVar4," p, ");
      iVar1 = *(int *)((long)aiStack_40 + lVar2);
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11bd8d;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11bd9c;
      std::operator<<(poVar4," g");
      if (-1 < (long)n_ion_populations) {
        aiStack_40[1] = iVar8;
        iVar8 = 0;
        for (lVar5 = 0; n_ion_populations != lVar5; lVar5 = lVar5 + 1) {
          iVar8 = iVar8 + *(int *)((long)aiStack_40 + lVar5 * 4 + lVar2 + 4);
        }
        aiStack_40[2] = aiStack_40[2] + iVar8;
        *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11bdd6;
        poVar4 = std::operator<<((ostream *)&std::cout,", ");
        *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11bde1;
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar8);
        *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11bdf0;
        std::operator<<(poVar4," i");
        iVar8 = aiStack_40[1];
      }
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11bdff;
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11be1a;
    poVar4 = std::operator<<((ostream *)&std::cout,"Total:  \t");
    iVar9 = aiStack_40[3];
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11be25;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar9);
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11be34;
    poVar4 = std::operator<<(poVar4," e, ");
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11be3f;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar8);
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11be4e;
    poVar4 = std::operator<<(poVar4," p, ");
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11be59;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar7);
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11be68;
    std::operator<<(poVar4," g");
    if (-1 < n_ion_populations) {
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11be84;
      poVar4 = std::operator<<((ostream *)&std::cout,", ");
      iVar8 = aiStack_40[2];
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11be8f;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar8);
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11be9e;
      std::operator<<(poVar4," i");
    }
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11beaa;
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  else {
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x11bcb5;
    MPI_Send(piVar10,uVar3,&ompi_mpi_int,0,0,&ompi_mpi_comm_world);
  }
  return;
}

Assistant:

void print_number_of_quasiparticles()
{
    // logging number of pseudoparticles in each thread
    int N_qp_e_total = 0;
    int N_qp_p_total = 0;
    int N_qp_g_total = 0;
    int N_qp_i_total = 0;

    int count = 3 + n_ion_populations;
    int data[count];
    data[0] = psr->N_qp_e;
    data[1] = psr->N_qp_p;
    data[2] = psr->N_qp_g;
    for (int j=0; j<n_ion_populations; j++) {
        data[3+j] = psr->N_qp_i[j];
    }

    if (mpi_rank == 0) {
        for (int i=0; i<n_sr; i++) {
            if (i != 0) {
                MPI_Recv(data, count, MPI_INT, i, 0, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
            }
            N_qp_e_total += data[0];
            N_qp_p_total += data[1];
            N_qp_g_total += data[2];
            cout << " Thread #" << i << ":\t" << data[0] << " e, " << data[1] << " p, " << data[2] << " g";
            if (n_ion_populations >= 0)
            {
                int N_qp_i = 0;
                for (int j=0; j<n_ion_populations; j++)
                {
                    N_qp_i += data[3+j];
                }
                N_qp_i_total += N_qp_i;
                cout << ", " << N_qp_i << " i";
            }
            cout << endl;
        }
        cout << "Total:  \t" << N_qp_e_total << " e, " << N_qp_p_total << " p, " << N_qp_g_total << " g";
        if (n_ion_populations >= 0)
        {
            cout << ", " << N_qp_i_total << " i";
        }
        cout << endl;
    } else {
        MPI_Send(data, count, MPI_INT, 0, 0, MPI_COMM_WORLD);
    }
}